

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
* __thiscall
verilogAST::Transformer::visit
          (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           *__return_storage_ptr__,Transformer *this,
          variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
          *node)

{
  anon_class_8_1_8991fb9c local_10;
  
  local_10.this = this;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/transformer.cpp:157:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
    ::_S_vtable._M_arr
    [(node->
     super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
     ).
     super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
     .
     super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
     .
     super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
     .
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
     ._M_index]._M_data)(__return_storage_ptr__,&local_10,node);
  return __return_storage_ptr__;
}

Assistant:

std::variant<std::unique_ptr<Identifier>, std::unique_ptr<Vector>>
Transformer::visit(
    std::variant<std::unique_ptr<Identifier>, std::unique_ptr<Vector>> node) {
  return std::visit(
      [&](auto&& value) -> std::variant<std::unique_ptr<Identifier>,
                                        std::unique_ptr<Vector>> {
        if (auto ptr = dynamic_cast<Identifier*>(value.get())) {
          value.release();
          return this->visit(std::unique_ptr<Identifier>(ptr));
        }
        if (auto ptr = dynamic_cast<Vector*>(value.get())) {
          value.release();
          return this->visit(std::unique_ptr<Vector>(ptr));
        }
        throw std::runtime_error("Unreachable");  // LCOV_EXCL_LINE
        return std::move(value);                  // LCOV_EXCL_LINE
      },
      node);
}